

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O3

ptr_t __thiscall
aeron::util::MemoryMappedFile::mapExisting
          (MemoryMappedFile *this,char *filename,off_t offset,size_t length)

{
  char *pcVar1;
  FileHandle fd_00;
  long *plVar2;
  MemoryMappedFile *this_00;
  SourcedException *this_01;
  char *pcVar3;
  size_type *psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *pcVar5;
  ptr_t pVar6;
  FileHandle fd;
  allocator local_b5;
  int local_b4;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  fd_00.handle = open64(filename,2,0x1b6);
  local_b4 = fd_00.handle;
  if (-1 < fd_00.handle) {
    plVar2 = (long *)operator_new(0x10);
    *plVar2 = (long)&PTR__FuncHolder_00186850;
    plVar2[1] = (long)&local_b4;
    this_00 = (MemoryMappedFile *)operator_new(0x10);
    MemoryMappedFile(this_00,fd_00,offset,length);
    this->m_memory = (uint8_t *)this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<aeron::util::MemoryMappedFile*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_memorySize,this_00);
    (**(code **)(*plVar2 + 8))(plVar2);
    pVar6.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    pVar6.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this;
    return (ptr_t)pVar6.
                  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (SourcedException *)__cxa_allocate_exception(0x48);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"failed to open existing file: ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
  local_b0._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_4_ = (undefined4)plVar2[3];
    local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::mapExisting(const char *, off_t, size_t)"
             ,"");
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
  ;
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar3 = pcVar3 + 1;
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar3 == *pcVar1);
  std::__cxx11::string::string((string *)&local_50,pcVar5 + (*pcVar1 == '/'),&local_b5);
  SourcedException::SourcedException(this_01,&local_b0,&local_70,&local_50,0x96);
  *(undefined ***)this_01 = &PTR__SourcedException_001867f0;
  __cxa_throw(this_01,&IOException::typeinfo,SourcedException::~SourcedException);
}

Assistant:

MemoryMappedFile::ptr_t MemoryMappedFile::mapExisting(const char *filename, off_t offset, size_t length)
{
    FileHandle fd;
    fd.handle = ::open(filename, O_RDWR, 0666);

    if (fd.handle < 0)
    {
        throw IOException(std::string("failed to open existing file: ") + filename, SOURCEINFO);
    }

    OnScopeExit tidy([&]()
    {
        close(fd.handle);
    });

    return MemoryMappedFile::ptr_t(new MemoryMappedFile(fd, offset, length));
}